

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# start_thread.c
# Opt level: O3

void nsync::nsync_start_thread_(_func_void_void_ptr *f,void *arg)

{
  pthread_t in_RAX;
  undefined8 *__arg;
  pthread_t t;
  pthread_t local_18;
  
  local_18 = in_RAX;
  __arg = (undefined8 *)malloc(0x10);
  *__arg = f;
  __arg[1] = arg;
  pthread_create(&local_18,(pthread_attr_t *)0x0,body,__arg);
  pthread_detach(local_18);
  return;
}

Assistant:

void nsync_start_thread_ (void (*f) (void *), void *arg) {
	struct thd_args *args = (struct thd_args *) malloc (sizeof (*args));
	pthread_t t;
	args->f = f;
	args->arg = arg;
	pthread_create (&t, NULL, body, args);
	pthread_detach (t);
}